

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgBinaryOps.cpp
# Opt level: O3

void __thiscall
rsg::EqualityComparisonOp<false>::EqualityComparisonOp
          (EqualityComparisonOp<false> *this,GeneratorState *state,
          ConstValueRangeAccess inValueRange)

{
  VariableType *this_00;
  ValueRange *this_01;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ValueRange *this_02;
  bool bVar2;
  int iVar3;
  pointer pSVar4;
  pointer pSVar5;
  deRandom *rnd;
  ValueRangeAccess valueRange_00;
  Type TVar6;
  byte bVar7;
  int iVar8;
  deUint32 dVar9;
  deBool dVar10;
  deUint32 dVar11;
  bool bVar12;
  float *aMax;
  long lVar13;
  pointer pSVar14;
  float *aMin;
  pointer pSVar15;
  pointer pSVar16;
  float *bMin;
  pointer pSVar17;
  float *bMax;
  uint uVar18;
  bool bVar19;
  float fVar20;
  float fVar21;
  Type inBaseTypes [2];
  Type val;
  ValueRange valueRange;
  Type local_1a0 [2];
  ValueRange *local_198;
  Scalar *pSStack_190;
  Scalar *local_188;
  ValueRange local_180;
  VariableType local_100;
  ValueRange local_b0;
  
  BinaryOp<8,_(rsg::Associativity)0>::BinaryOp
            (&this->super_BinaryOp<8,_(rsg::Associativity)0>,CMP_NE);
  (this->super_BinaryOp<8,_(rsg::Associativity)0>).super_Expression._vptr_Expression =
       (_func_int **)&PTR__BinaryOp_00788318;
  ValueRange::ValueRange(&local_b0,inValueRange);
  paVar1 = &local_100.m_typeName.field_2;
  if (local_b0.m_type.m_baseType == TYPE_VOID) {
    local_100.m_baseType = TYPE_BOOL;
    local_100.m_precision = PRECISION_NONE;
    local_100.m_typeName._M_string_length = 0;
    local_100.m_typeName.field_2._M_local_buf[0] = '\0';
    local_100.m_numElements = 1;
    local_100.m_elementType = (VariableType *)0x0;
    local_100.m_members.
    super__Vector_base<rsg::VariableType::Member,_std::allocator<rsg::VariableType::Member>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_100.m_members.
    super__Vector_base<rsg::VariableType::Member,_std::allocator<rsg::VariableType::Member>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_100.m_members.
    super__Vector_base<rsg::VariableType::Member,_std::allocator<rsg::VariableType::Member>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_100.m_typeName._M_dataplus._M_p = (pointer)paVar1;
    ValueRange::ValueRange(&local_180,&local_100);
    VariableType::operator=(&local_b0.m_type,&local_180.m_type);
    std::vector<rsg::Scalar,_std::allocator<rsg::Scalar>_>::operator=
              (&local_b0.m_min,&local_180.m_min);
    std::vector<rsg::Scalar,_std::allocator<rsg::Scalar>_>::operator=
              (&local_b0.m_max,&local_180.m_max);
    ValueRange::~ValueRange(&local_180);
    VariableType::~VariableType(&local_100);
    pSStack_190 = local_b0.m_min.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>.
                  _M_impl.super__Vector_impl_data._M_start;
    if (local_b0.m_min.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
        super__Vector_impl_data._M_start ==
        local_b0.m_min.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      pSStack_190 = (Scalar *)0x0;
    }
    local_188 = local_b0.m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl
                .super__Vector_impl_data._M_start;
    if (local_b0.m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
        super__Vector_impl_data._M_start ==
        local_b0.m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      local_188 = (Scalar *)0x0;
    }
    valueRange_00.super_ConstValueRangeAccess.m_min = pSStack_190;
    valueRange_00.super_ConstValueRangeAccess.m_type = &local_b0.m_type;
    valueRange_00.super_ConstValueRangeAccess.m_max = local_188;
    local_198 = &local_b0;
    computeRandomValueRange(state,valueRange_00);
  }
  this_00 = &(this->super_BinaryOp<8,_(rsg::Associativity)0>).m_type;
  VariableType::operator=(this_00,&local_b0.m_type);
  iVar8 = VariableType::getScalarSize(this_00);
  std::vector<rsg::Scalar,_std::allocator<rsg::Scalar>_>::resize
            (&(this->super_BinaryOp<8,_(rsg::Associativity)0>).m_value.m_value,(long)(iVar8 << 6));
  local_1a0[0] = TYPE_FLOAT;
  local_1a0[1] = TYPE_INT;
  local_180.m_type.m_baseType = TYPE_VOID;
  de::Random::choose<rsg::VariableType::Type*,rsg::VariableType::Type*>
            (state->m_random,local_1a0,(Type *)&local_198,(Type *)&local_180,1);
  TVar6 = local_180.m_type.m_baseType;
  iVar8 = state->m_shaderParams->maxExpressionDepth;
  iVar3 = state->m_expressionDepth;
  dVar9 = deRandom_getUint32(&state->m_random->m_rnd);
  uVar18 = (uint)(2 < iVar8 - iVar3) * 3 & dVar9;
  iVar8 = uVar18 + 1;
  local_100.m_precision = PRECISION_NONE;
  local_100.m_baseType = TVar6;
  local_100.m_typeName._M_string_length = 0;
  local_100.m_typeName.field_2._M_local_buf[0] = '\0';
  local_100.m_elementType = (VariableType *)0x0;
  local_100.m_members.
  super__Vector_base<rsg::VariableType::Member,_std::allocator<rsg::VariableType::Member>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_100.m_members.
  super__Vector_base<rsg::VariableType::Member,_std::allocator<rsg::VariableType::Member>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_100.m_members.
  super__Vector_base<rsg::VariableType::Member,_std::allocator<rsg::VariableType::Member>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_100.m_typeName._M_dataplus._M_p = (pointer)paVar1;
  local_100.m_numElements = iVar8;
  ValueRange::ValueRange(&local_180,&local_100);
  this_02 = &(this->super_BinaryOp<8,_(rsg::Associativity)0>).m_rightValueRange;
  VariableType::operator=(&this_02->m_type,&local_180.m_type);
  std::vector<rsg::Scalar,_std::allocator<rsg::Scalar>_>::operator=
            (&(this->super_BinaryOp<8,_(rsg::Associativity)0>).m_rightValueRange.m_min,
             &local_180.m_min);
  std::vector<rsg::Scalar,_std::allocator<rsg::Scalar>_>::operator=
            (&(this->super_BinaryOp<8,_(rsg::Associativity)0>).m_rightValueRange.m_max,
             &local_180.m_max);
  ValueRange::~ValueRange(&local_180);
  VariableType::~VariableType(&local_100);
  local_100.m_precision = PRECISION_NONE;
  local_100.m_typeName._M_string_length = 0;
  local_100.m_typeName.field_2._M_local_buf[0] = '\0';
  local_100.m_elementType = (VariableType *)0x0;
  local_100.m_members.
  super__Vector_base<rsg::VariableType::Member,_std::allocator<rsg::VariableType::Member>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_100.m_members.
  super__Vector_base<rsg::VariableType::Member,_std::allocator<rsg::VariableType::Member>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_100.m_members.
  super__Vector_base<rsg::VariableType::Member,_std::allocator<rsg::VariableType::Member>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_100.m_typeName._M_dataplus._M_p = (pointer)paVar1;
  local_100.m_numElements = iVar8;
  ValueRange::ValueRange(&local_180,&local_100);
  this_01 = &(this->super_BinaryOp<8,_(rsg::Associativity)0>).m_leftValueRange;
  VariableType::operator=(&this_01->m_type,&local_180.m_type);
  std::vector<rsg::Scalar,_std::allocator<rsg::Scalar>_>::operator=
            (&(this->super_BinaryOp<8,_(rsg::Associativity)0>).m_leftValueRange.m_min,
             &local_180.m_min);
  std::vector<rsg::Scalar,_std::allocator<rsg::Scalar>_>::operator=
            (&(this->super_BinaryOp<8,_(rsg::Associativity)0>).m_leftValueRange.m_max,
             &local_180.m_max);
  ValueRange::~ValueRange(&local_180);
  VariableType::~VariableType(&local_100);
  lVar13 = 0;
  do {
    bVar2 = (local_b0.m_min.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
             super__Vector_impl_data._M_start)->boolVal;
    bVar12 = (local_b0.m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
              super__Vector_impl_data._M_start)->boolVal;
    pSVar14 = (this->super_BinaryOp<8,_(rsg::Associativity)0>).m_leftValueRange.m_min.
              super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
              super__Vector_impl_data._M_start;
    pSVar16 = (this->super_BinaryOp<8,_(rsg::Associativity)0>).m_leftValueRange.m_min.
              super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
              super__Vector_impl_data._M_finish;
    pSVar15 = (this->super_BinaryOp<8,_(rsg::Associativity)0>).m_leftValueRange.m_max.
              super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
              super__Vector_impl_data._M_start;
    pSVar4 = (this->super_BinaryOp<8,_(rsg::Associativity)0>).m_leftValueRange.m_max.
             super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
             super__Vector_impl_data._M_finish;
    VariableType::getElementType(&this_01->m_type);
    if (pSVar15 == pSVar4) {
      pSVar15 = (pointer)0x0;
    }
    if (pSVar14 == pSVar16) {
      pSVar14 = (pointer)0x0;
    }
    pSVar16 = (this->super_BinaryOp<8,_(rsg::Associativity)0>).m_rightValueRange.m_min.
              super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
              super__Vector_impl_data._M_start;
    pSVar4 = (this->super_BinaryOp<8,_(rsg::Associativity)0>).m_rightValueRange.m_min.
             super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
             super__Vector_impl_data._M_finish;
    pSVar17 = (this->super_BinaryOp<8,_(rsg::Associativity)0>).m_rightValueRange.m_max.
              super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
              super__Vector_impl_data._M_start;
    pSVar5 = (this->super_BinaryOp<8,_(rsg::Associativity)0>).m_rightValueRange.m_max.
             super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
             super__Vector_impl_data._M_finish;
    VariableType::getElementType(&this_02->m_type);
    aMin = (float *)((long)pSVar14 + lVar13);
    aMax = (float *)((long)pSVar15 + lVar13);
    if (pSVar17 == pSVar5) {
      pSVar17 = (pointer)0x0;
    }
    if (pSVar16 == pSVar4) {
      pSVar16 = (pointer)0x0;
    }
    bMin = (float *)((long)pSVar16 + lVar13);
    bMax = (float *)((long)pSVar17 + lVar13);
    rnd = &state->m_random->m_rnd;
    bVar7 = bVar12 ^ 1;
    if (TVar6 == TYPE_INT) {
      if (bVar7 == 0 && bVar2 == false) {
        dVar9 = deRandom_getUint32(rnd);
        dVar11 = deRandom_getUint32(rnd);
        fVar20 = (float)(dVar11 % 9 - 4);
        fVar21 = (float)(dVar9 % 9 + (int)fVar20);
        *aMin = fVar20;
        *aMax = fVar21;
        *bMin = fVar20;
        *bMax = fVar21;
      }
      else if (bVar2 == false) {
        dVar9 = deRandom_getUint32(rnd);
        fVar20 = (float)(~((dVar9 / 3) * 3) + dVar9);
        *aMin = fVar20;
        *aMax = fVar20;
        *bMin = fVar20;
        *bMax = fVar20;
      }
      else {
        ComputeLessThanRange::operator()
                  ((ComputeLessThanRange *)&local_180,(Random *)rnd,true,true,(int *)aMin,
                   (int *)aMax,(int *)bMin,(int *)bMax);
      }
    }
    else if (TVar6 == TYPE_FLOAT) {
      if (bVar7 == 0 && bVar2 == false) {
        dVar9 = deRandom_getUint32(rnd);
        dVar11 = deRandom_getUint32(rnd);
        fVar21 = (float)(dVar11 % 0x21) * 0.25 + -4.0;
        fVar20 = (float)(dVar9 % 0x21) * 0.25 + 0.0 + fVar21;
        *aMin = fVar21;
        *aMax = fVar20;
        *bMin = fVar21;
      }
      else {
        if (bVar2 != false) {
          ComputeLessThanRange::operator()
                    ((ComputeLessThanRange *)&local_180,(Random *)rnd,true,true,aMin,aMax,bMin,bMax)
          ;
          goto LAB_005c09c8;
        }
        dVar9 = deRandom_getUint32(rnd);
        fVar20 = (float)(dVar9 % 5) * 0.5 + -1.0;
        *aMin = fVar20;
        *aMax = fVar20;
        *bMin = fVar20;
      }
      *bMax = fVar20;
    }
    else {
      if ((bVar7 == 0 && bVar2 == false) || (bVar2 == true && bVar12 == false)) {
        *(undefined1 *)aMin = 0;
        *(undefined1 *)aMax = 1;
        bVar19 = true;
        bVar12 = false;
      }
      else {
        dVar10 = deRandom_getBool(rnd);
        bVar19 = dVar10 == 1;
        *(bool *)aMin = bVar19;
        *(bool *)aMax = bVar19;
        bVar12 = bVar19;
        if (bVar2 != false) {
          bVar19 = dVar10 != 1;
          bVar12 = bVar19;
        }
      }
      *(bool *)bMin = bVar12;
      *(bool *)bMax = bVar19;
    }
LAB_005c09c8:
    lVar13 = lVar13 + 4;
    if ((ulong)uVar18 * 4 + 4 == lVar13) {
      ValueRange::~ValueRange(&local_b0);
      return;
    }
  } while( true );
}

Assistant:

EqualityComparisonOp<IsEqual>::EqualityComparisonOp (GeneratorState& state, ConstValueRangeAccess inValueRange)
	: BinaryOp<8, ASSOCIATIVITY_LEFT>(IsEqual ? Token::CMP_EQ : Token::CMP_NE)
{
	ValueRange valueRange = inValueRange;

	if (valueRange.getType().isVoid())
	{
		valueRange = ValueRange(VariableType(VariableType::TYPE_BOOL, 1));
		computeRandomValueRange(state, valueRange.asAccess());
	}

	// Choose type, allocate storage for execution
	this->m_type = valueRange.getType();
	this->m_value.setStorage(this->m_type);

	// Choose random input type
	VariableType::Type inBaseTypes[]	= { VariableType::TYPE_FLOAT, VariableType::TYPE_INT };
	VariableType::Type inBaseType		= state.getRandom().choose<VariableType::Type>(&inBaseTypes[0], &inBaseTypes[DE_LENGTH_OF_ARRAY(inBaseTypes)]);
	int					availableLevels	= state.getShaderParameters().maxExpressionDepth - state.getExpressionDepth();
	int					numElements		= state.getRandom().getInt(1, availableLevels >= 3 ? 4 : 1);

	// Initialize storage for input value ranges
	this->m_rightValueRange	= ValueRange(VariableType(inBaseType, numElements));
	this->m_leftValueRange	= ValueRange(VariableType(inBaseType, numElements));

	// Compute range for b that satisfies requested value range
	for (int elementNdx = 0; elementNdx < numElements; elementNdx++)
	{
		bool					dstMin	= valueRange.getMin().asBool();
		bool					dstMax	= valueRange.getMax().asBool();

		ValueRangeAccess		a		= this->m_leftValueRange.asAccess().component(elementNdx);
		ValueRangeAccess		b		= this->m_rightValueRange.asAccess().component(elementNdx);

		if (inBaseType == VariableType::TYPE_FLOAT)
			computeEqualityValueRange<IsEqual>(state.getRandom(), dstMin, dstMax,
											   a.getMin().asFloat(), a.getMax().asFloat(),
											   b.getMin().asFloat(), b.getMax().asFloat());
		else if (inBaseType == VariableType::TYPE_INT)
			computeEqualityValueRange<IsEqual>(state.getRandom(), dstMin, dstMax,
											   a.getMin().asInt(), a.getMax().asInt(),
											   b.getMin().asInt(), b.getMax().asInt());
		else
		{
			DE_ASSERT(inBaseType == VariableType::TYPE_BOOL);
			computeEqualityValueRange<IsEqual>(state.getRandom(), dstMin, dstMax,
											   a.getMin().asBool(), a.getMax().asBool(),
											   b.getMin().asBool(), b.getMax().asBool());
		}
	}
}